

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

LoadFileStatus lf_load(LoadedFile *lf,Filename *filename)

{
  FILE *__stream;
  LoadFileStatus status;
  FILE *fp;
  Filename *filename_local;
  LoadedFile *lf_local;
  
  __stream = (FILE *)f_open(filename,"rb",false);
  if (__stream == (FILE *)0x0) {
    lf_local._4_4_ = LF_ERROR;
  }
  else {
    lf_local._4_4_ = lf_load_fp(lf,(FILE *)__stream);
    fclose(__stream);
  }
  return lf_local._4_4_;
}

Assistant:

LoadFileStatus lf_load(LoadedFile *lf, const Filename *filename)
{
    FILE *fp = f_open(filename, "rb", false);
    if (!fp)
        return LF_ERROR;

    LoadFileStatus status = lf_load_fp(lf, fp);
    fclose(fp);
    return status;
}